

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_freeBufferPool(ZSTDMT_bufferPool *bufPool)

{
  uint local_14;
  uint u;
  ZSTDMT_bufferPool *bufPool_local;
  
  if (bufPool != (ZSTDMT_bufferPool *)0x0) {
    for (local_14 = 0; local_14 < bufPool->totalBuffers; local_14 = local_14 + 1) {
      ZSTD_free(bufPool->bTable[local_14].start,bufPool->cMem);
    }
    pthread_mutex_destroy((pthread_mutex_t *)bufPool);
    ZSTD_free(bufPool,bufPool->cMem);
  }
  return;
}

Assistant:

static void ZSTDMT_freeBufferPool(ZSTDMT_bufferPool* bufPool)
{
    unsigned u;
    DEBUGLOG(3, "ZSTDMT_freeBufferPool (address:%08X)", (U32)(size_t)bufPool);
    if (!bufPool) return;   /* compatibility with free on NULL */
    for (u=0; u<bufPool->totalBuffers; u++) {
        DEBUGLOG(4, "free buffer %2u (address:%08X)", u, (U32)(size_t)bufPool->bTable[u].start);
        ZSTD_free(bufPool->bTable[u].start, bufPool->cMem);
    }
    ZSTD_pthread_mutex_destroy(&bufPool->poolMutex);
    ZSTD_free(bufPool, bufPool->cMem);
}